

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Qt::DayOfWeek>::relocate
          (QArrayDataPointer<Qt::DayOfWeek> *this,qsizetype offset,DayOfWeek **data)

{
  bool bVar1;
  DayOfWeek *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  DayOfWeek *res;
  
  first = (DayOfWeek *)(*(long *)(in_RDI + 8) + in_RSI * 4);
  QtPrivate::q_relocate_overlap_n<Qt::DayOfWeek,long_long>(first,in_RDI,(DayOfWeek *)0x4f0767);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<Qt::DayOfWeek>,Qt::DayOfWeek_const*>
                        (data,(QArrayDataPointer<Qt::DayOfWeek> *)res), bVar1)) {
    *in_RDX = in_RSI * 4 + *in_RDX;
  }
  *(DayOfWeek **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }